

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O1

void erode_obj(obj *target,boolean acid_dmg,boolean fade_scrolls)

{
  boolean bVar1;
  char *pcVar2;
  ushort uVar3;
  uint uVar4;
  char *pcVar5;
  byte bVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  monst *worm;
  bool bVar10;
  
  if (target == (obj *)0x0) {
    return;
  }
  if (target->where == '\x03') {
    worm = &youmonst;
  }
  else if (target->where == '\x04') {
    worm = (target->v).v_ocarry;
  }
  else {
    worm = (monst *)0x0;
  }
  bVar10 = true;
  bVar6 = 1;
  if (worm != &youmonst && worm != (monst *)0x0) {
    if (worm->wormno == '\0') {
      if (((viz_array[worm->my][worm->mx] & 2U) != 0) ||
         (((((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((bVar6 = 1, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
            (bVar6 = 1, ((youmonst.data)->mflags3 & 0x100) != 0)))) &&
          ((bVar6 = 1, (viz_array[worm->my][worm->mx] & 1U) != 0 &&
           ((worm->data->mflags3 & 0x200) != 0)))))) goto LAB_00287917;
    }
    else {
      bVar1 = worm_known(level,worm);
      bVar6 = 1;
      if (bVar1 != '\0') {
LAB_00287917:
        bVar6 = 1;
        uVar9 = *(uint *)&worm->field_0x60;
        if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if (-1 < (char)uVar9) goto LAB_00287959;
        }
        else if ((-1 < (char)uVar9) && (bVar6 = 1, ((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00287959:
          bVar6 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar9 >> 9) & 1;
        }
      }
    }
  }
  if (worm == (monst *)0x0) {
    bVar10 = (viz_array[bhitpos.y][bhitpos.x] & 2U) == 0;
  }
  uVar9 = *(uint *)&target->field_0x4a;
  if ((uVar9 >> 0x14 & 1) != 0) {
    grease_protect(target,(char *)0x0,worm);
    return;
  }
  if (target->oclass == '\t') {
    if (fade_scrolls == '\0') {
      return;
    }
    if (target->otyp == 0x17c) {
      return;
    }
    if ((((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
        || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
       ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) goto LAB_00287d77;
    if (worm == &youmonst) {
      pcVar2 = aobjnam(target,"fade");
      pcVar8 = "Your %s.";
    }
    else {
      if (bVar6 == 0) {
        pcVar2 = Monnam(worm);
        pcVar8 = aobjnam(target,"fade");
        pline("%s\'s %s.",pcVar2,pcVar8);
        goto LAB_00287d77;
      }
      if (bVar10) goto LAB_00287d77;
      pcVar2 = aobjnam(target,"fade");
      pcVar8 = "The %s.";
    }
    pline(pcVar8,pcVar2);
LAB_00287d77:
    target->otyp = 0x17c;
    target->spe = '\0';
    return;
  }
  if ((uVar9 >> 0xc & 1) != 0) {
LAB_00287ad0:
    if (((~uVar9 & 0x1080) != 0) || (flags.verbose != '\0')) {
      if (worm == &youmonst) {
        pcVar2 = aobjnam(target,"are");
        pline("Your %s not affected.",pcVar2);
      }
      else if (bVar6 == 0) {
        pcVar2 = Monnam(worm);
        pcVar8 = aobjnam(target,"are");
        pline("%s\'s %s not affected.",pcVar2,pcVar8);
      }
    }
    if ((*(uint *)&target->field_0x4a >> 0xc & 1) == 0) {
      return;
    }
    *(uint *)&target->field_0x4a = *(uint *)&target->field_0x4a | 0x80;
    return;
  }
  if (acid_dmg == '\0') {
    if ((*(ushort *)&objects[target->otyp].field_0x11 & 0x1f0) != 0xb0) goto LAB_00287ad0;
  }
  else {
    uVar3 = *(ushort *)&objects[target->otyp].field_0x11 >> 4 & 0x1f;
    if ((uVar3 != 0xb) && (uVar3 != 0xd)) goto LAB_00287ad0;
  }
  uVar9 = uVar9 >> ((acid_dmg != '\0') * '\x02' | 8U) & 3;
  if (uVar9 == 3) {
    if (flags.verbose == '\0') {
      return;
    }
    if (worm == &youmonst) {
      if ((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
        pcVar2 = "look";
      }
      else if (ublindf == (obj *)0x0) {
        pcVar2 = "feel";
      }
      else {
        pcVar2 = "feel";
        if (ublindf->oartifact == '\x1d') {
          pcVar2 = "look";
        }
      }
      pcVar2 = aobjnam(target,pcVar2);
      pcVar8 = "corroded";
      if (acid_dmg == '\0') {
        pcVar8 = "rusty";
      }
      pcVar7 = "Your %s completely %s.";
    }
    else {
      if (bVar6 == 0) {
        pcVar2 = Monnam(worm);
        pcVar8 = aobjnam(target,"look");
        pcVar7 = "corroded";
        if (acid_dmg == '\0') {
          pcVar7 = "rusty";
        }
        pline("%s\'s %s completely %s.",pcVar2,pcVar8,pcVar7);
        return;
      }
      if (bVar10) {
        return;
      }
      pcVar2 = aobjnam(target,"look");
      pcVar8 = "corroded";
      if (acid_dmg == '\0') {
        pcVar8 = "rusty";
      }
      pcVar7 = "The %s completely %s.";
    }
    pline(pcVar7,pcVar2,pcVar8);
    return;
  }
  if (worm == &youmonst) {
    pcVar2 = "corrode";
    if (acid_dmg == '\0') {
      pcVar2 = "rust";
    }
    pcVar2 = aobjnam(target,pcVar2);
    pcVar8 = " further";
    if (uVar9 == 0) {
      pcVar8 = "";
    }
    pcVar7 = " completely";
    if (uVar9 != 2) {
      pcVar7 = pcVar8;
    }
    pcVar8 = "Your %s%s!";
  }
  else {
    if (bVar6 == 0) {
      pcVar2 = Monnam(worm);
      pcVar8 = "corrode";
      if (acid_dmg == '\0') {
        pcVar8 = "rust";
      }
      pcVar8 = aobjnam(target,pcVar8);
      pcVar7 = " further";
      if (uVar9 == 0) {
        pcVar7 = "";
      }
      pcVar5 = " completely";
      if (uVar9 != 2) {
        pcVar5 = pcVar7;
      }
      pline("%s\'s %s%s!",pcVar2,pcVar8,pcVar5);
      goto LAB_00287cf4;
    }
    if (bVar10) goto LAB_00287cf4;
    pcVar2 = "corrode";
    if (acid_dmg == '\0') {
      pcVar2 = "rust";
    }
    pcVar2 = aobjnam(target,pcVar2);
    pcVar8 = " further";
    if (uVar9 == 0) {
      pcVar8 = "";
    }
    pcVar7 = " completely";
    if (uVar9 != 2) {
      pcVar7 = pcVar8;
    }
    pcVar8 = "The %s%s!";
  }
  pline(pcVar8,pcVar2,pcVar7);
LAB_00287cf4:
  uVar9 = *(uint *)&target->field_0x4a;
  if (acid_dmg == '\0') {
    uVar4 = uVar9 + 0x100 & 0x300;
    uVar9 = uVar9 & 0xfffffcff;
  }
  else {
    uVar4 = uVar9 + 0x400 & 0xc00;
    uVar9 = uVar9 & 0xfffff3ff;
  }
  *(uint *)&target->field_0x4a = uVar9 | uVar4;
  return;
}

Assistant:

void erode_obj(struct obj *target, /* object (e.g. weapon or armor) to erode */
	       boolean acid_dmg,
	       boolean fade_scrolls)
{
	int erosion;
	struct monst *victim;
	boolean vismon;
	boolean visobj;

	if (!target)
	    return;
	victim = carried(target) ? &youmonst :
	    mcarried(target) ? target->ocarry : NULL;
	vismon = victim && (victim != &youmonst) && canseemon(level, victim);
	visobj = !victim && cansee(bhitpos.x, bhitpos.y); /* assume thrown */

	erosion = acid_dmg ? target->oeroded2 : target->oeroded;

	if (target->greased) {
	    grease_protect(target,NULL,victim);
	} else if (target->oclass == SCROLL_CLASS) {
	    if (fade_scrolls && target->otyp != SCR_BLANK_PAPER)
	    {
		if (!Blind) {
		    if (victim == &youmonst)
			pline("Your %s.", aobjnam(target, "fade"));
		    else if (vismon)
			pline("%s's %s.", Monnam(victim),
			      aobjnam(target, "fade"));
		    else if (visobj)
			pline("The %s.", aobjnam(target, "fade"));
		}
		target->otyp = SCR_BLANK_PAPER;
		target->spe = 0;
	    }
	} else if (target->oerodeproof ||
		(acid_dmg ? !is_corrodeable(target) : !is_rustprone(target))) {
	    if (flags.verbose || !(target->oerodeproof && target->rknown)) {
		if (victim == &youmonst)
		    pline("Your %s not affected.", aobjnam(target, "are"));
		else if (vismon)
		    pline("%s's %s not affected.", Monnam(victim),
			aobjnam(target, "are"));
		/* no message if not carried */
	    }
	    if (target->oerodeproof) target->rknown = TRUE;
	} else if (erosion < MAX_ERODE) {
	    if (victim == &youmonst)
		pline("Your %s%s!", aobjnam(target, acid_dmg ? "corrode" : "rust"),
		    erosion+1 == MAX_ERODE ? " completely" :
		    erosion ? " further" : "");
	    else if (vismon)
		pline("%s's %s%s!", Monnam(victim),
		    aobjnam(target, acid_dmg ? "corrode" : "rust"),
		    erosion+1 == MAX_ERODE ? " completely" :
		    erosion ? " further" : "");
	    else if (visobj)
		pline("The %s%s!",
		    aobjnam(target, acid_dmg ? "corrode" : "rust"),
		    erosion+1 == MAX_ERODE ? " completely" :
		    erosion ? " further" : "");
	    if (acid_dmg)
		target->oeroded2++;
	    else
		target->oeroded++;
	} else {
	    if (flags.verbose) {
		if (victim == &youmonst)
		    pline("Your %s completely %s.",
			aobjnam(target, Blind ? "feel" : "look"),
			acid_dmg ? "corroded" : "rusty");
		else if (vismon)
		    pline("%s's %s completely %s.", Monnam(victim),
			aobjnam(target, "look"),
			acid_dmg ? "corroded" : "rusty");
		else if (visobj)
		    pline("The %s completely %s.",
			aobjnam(target, "look"),
			acid_dmg ? "corroded" : "rusty");
	    }
	}
}